

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueStore.cpp
# Opt level: O2

void __thiscall xercesc_4_0::ValueStore::startValueScope(ValueStore *this)

{
  RefVectorOf<xercesc_4_0::IC_Field> *pRVar1;
  IC_Field *key;
  XMLSize_t XVar2;
  XMLSize_t i;
  XMLSize_t index;
  
  this->fValuesCount = 0;
  pRVar1 = this->fIdentityConstraint->fFields;
  if (pRVar1 == (RefVectorOf<xercesc_4_0::IC_Field> *)0x0) {
    XVar2 = 0;
  }
  else {
    XVar2 = (pRVar1->super_BaseRefVectorOf<xercesc_4_0::IC_Field>).fCurCount;
  }
  for (index = 0; XVar2 != index; index = index + 1) {
    key = IdentityConstraint::getFieldAt(this->fIdentityConstraint,index);
    FieldValueMap::put(&this->fValues,key,(DatatypeValidator *)0x0,(XMLCh *)0x0);
  }
  return;
}

Assistant:

void ValueStore::startValueScope() {

    fValuesCount = 0;

    XMLSize_t count = fIdentityConstraint->getFieldCount();

    for (XMLSize_t i = 0; i < count; i++) {
        fValues.put(fIdentityConstraint->getFieldAt(i), 0, 0);
    }
}